

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::~StreamingReporterBase
          (StreamingReporterBase<Catch::ConsoleReporter> *this)

{
  GroupInfo *pGVar1;
  pointer pcVar2;
  TestRunInfo *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__StreamingReporterBase_001a2b48;
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&this->m_sectionStack);
  Option<Catch::TestCaseInfo>::reset(&(this->currentTestCaseInfo).super_Option<Catch::TestCaseInfo>)
  ;
  pGVar1 = (this->currentGroupInfo).super_Option<Catch::GroupInfo>.nullableValue;
  if ((pGVar1 != (GroupInfo *)0x0) &&
     (pcVar2 = (pGVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pGVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  (this->currentGroupInfo).super_Option<Catch::GroupInfo>.nullableValue = (GroupInfo *)0x0;
  pTVar3 = (this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.nullableValue;
  if ((pTVar3 != (TestRunInfo *)0x0) &&
     (pcVar2 = (pTVar3->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pTVar3->name).field_2)) {
    operator_delete(pcVar2);
  }
  (this->currentTestRunInfo).super_Option<Catch::TestRunInfo>.nullableValue = (TestRunInfo *)0x0;
  this_00 = (this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

~StreamingReporterBase() override = default;